

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

allocator_base<std::allocator<unsigned_char>_> * __thiscall
poly::vector_impl::allocator_base<std::allocator<unsigned_char>_>::copy_assign_impl
          (allocator_base<std::allocator<unsigned_char>_> *this,long *a)

{
  uchar *puVar1;
  
  if (a[1] - *a == 0) {
    puVar1 = (uchar *)0x0;
  }
  else {
    puVar1 = __gnu_cxx::new_allocator<unsigned_char>::allocate
                       ((new_allocator<unsigned_char> *)this,a[1] - *a,(void *)0x0);
  }
  tidy(this);
  this->_storage = puVar1;
  this->_end_storage = puVar1 + (a[1] - *a);
  return this;
}

Assistant:

allocator_base& copy_assign_impl(const allocator_base& a, std::false_type /*unused*/)
        {
            pointer s = nullptr;
            if (a.size()) {
                s = get_allocator_ref().allocate(a.size());
            }
            tidy();
            _storage     = s;
            _end_storage = s + a.size();
            return *this;
        }